

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kaitaistream.cpp
# Opt level: O2

uint16_t __thiscall kaitai::kstream::read_u2le(kstream *this)

{
  uint16_t t;
  
  std::istream::read((char *)this->m_io,(long)&t);
  return t;
}

Assistant:

uint16_t kaitai::kstream::read_u2le() {
    uint16_t t;
    m_io->read(reinterpret_cast<char *>(&t), 2);
#if __BYTE_ORDER == __BIG_ENDIAN
    t = bswap_16(t);
#endif
    return t;
}